

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# adlmidi_midiplay.cpp
# Opt level: O0

void __thiscall MIDIplay::noteOff(MIDIplay *this,size_t midCh,uint8_t note,bool forceNow)

{
  bool bVar1;
  pl_cell<MIDIplay::MIDIchannel::NoteInfo> *ppVar2;
  NoteInfo *ni;
  notes_iterator i;
  MIDIchannel *ch;
  bool forceNow_local;
  uint8_t note_local;
  size_t midCh_local;
  MIDIplay *this_local;
  
  i.cell_ = (pl_cell<MIDIplay::MIDIchannel::NoteInfo> *)
            std::vector<MIDIplay::MIDIchannel,_std::allocator<MIDIplay::MIDIchannel>_>::operator[]
                      (&this->m_midiChannels,midCh);
  ni = (NoteInfo *)MIDIchannel::find_activenote((MIDIchannel *)i.cell_,(uint)note);
  bVar1 = pl_iterator<pl_cell<MIDIplay::MIDIchannel::NoteInfo>_>::is_end
                    ((pl_iterator<pl_cell<MIDIplay::MIDIchannel::NoteInfo>_> *)&ni);
  if (!bVar1) {
    ppVar2 = pl_iterator<pl_cell<MIDIplay::MIDIchannel::NoteInfo>_>::operator->
                       ((pl_iterator<pl_cell<MIDIplay::MIDIchannel::NoteInfo>_> *)&ni);
    if ((forceNow) || ((ppVar2->value).ttl <= 0.0)) {
      noteUpdate(this,midCh,(notes_iterator)ni,0x20,-1);
    }
    else {
      (ppVar2->value).isOnExtendedLifeTime = true;
    }
  }
  return;
}

Assistant:

void MIDIplay::noteOff(size_t midCh, uint8_t note, bool forceNow)
{
    MIDIchannel &ch = m_midiChannels[midCh];
    MIDIchannel::notes_iterator i = ch.find_activenote(note);

    if(!i.is_end())
    {
        MIDIchannel::NoteInfo &ni = i->value;
        if(forceNow || ni.ttl <= 0)
            noteUpdate(midCh, i, Upd_Off);
        else
            ni.isOnExtendedLifeTime = true;
    }
}